

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O1

bool __thiscall
GEO::SystemEnvironment::get_local_value(SystemEnvironment *this,string *name,string *value)

{
  char *__s;
  size_t sVar1;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  __s = getenv((name->_M_dataplus)._M_p);
  if (__s != (char *)0x0) {
    local_40[0] = local_30;
    sVar1 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_40,__s,__s + sVar1);
    std::__cxx11::string::operator=((string *)value,(string *)local_40);
    if (local_40[0] != local_30) {
      operator_delete(local_40[0]);
    }
  }
  return __s != (char *)0x0;
}

Assistant:

bool SystemEnvironment::get_local_value(
        const std::string& name, std::string& value
    ) const {
        // For the moment, deactivated under Windows
#ifdef GEO_OS_WINDOWS
        geo_argused(name);
        geo_argused(value);
        return false;
#else
        char* result = ::getenv(name.c_str());
        if(result != nullptr) {
            value = std::string(result);
        }
        return result != nullptr;
#endif
    }